

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  PoolAllocatorPrivate *pPVar1;
  _List_node_base *p_Var2;
  int iVar3;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator cVar4;
  _List_node_base *p_Var5;
  value_type local_38;
  
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  pPVar1 = this->d;
  __position._M_node =
       (pPVar1->budgets).
       super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  cVar4._M_node = __position._M_node;
  __position_00._M_node = __position._M_node;
  for (; __position._M_node != (_List_node_base *)&pPVar1->budgets;
      __position._M_node = (__position._M_node)->_M_next) {
    p_Var2 = __position._M_node[1]._M_next;
    if ((size <= p_Var2) && ((ulong)pPVar1->size_compare_ratio * (long)p_Var2 >> 8 <= size)) {
      p_Var5 = __position._M_node[1]._M_prev;
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      erase(&pPVar1->budgets,__position);
      pthread_mutex_unlock((pthread_mutex_t *)this->d);
      pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
      pPVar1 = this->d;
      local_38.first = (unsigned_long)p_Var2;
      goto LAB_004ed5e4;
    }
    if (p_Var2 < cVar4._M_node[1]._M_next) {
      cVar4._M_node = __position._M_node;
    }
    if (__position_00._M_node[1]._M_next < p_Var2) {
      __position_00._M_node = __position._M_node;
    }
  }
  if (pPVar1->size_drop_threshold <=
      (pPVar1->budgets).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node._M_size) {
    if (__position_00._M_node[1]._M_next < size) {
      free(cVar4._M_node[1]._M_prev);
      pPVar1 = this->d;
      __position_00._M_node = cVar4._M_node;
    }
    else {
      if (cVar4._M_node[1]._M_next <= size) goto LAB_004ed5a0;
      free(__position_00._M_node[1]._M_prev);
      pPVar1 = this->d;
    }
    std::__cxx11::
    list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
    erase(&pPVar1->budgets,__position_00);
  }
LAB_004ed5a0:
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  local_38.first = 0;
  iVar3 = posix_memalign((void **)&local_38,0x40,size + 0x40);
  p_Var5 = (_List_node_base *)local_38.first;
  if (iVar3 != 0) {
    p_Var5 = (_List_node_base *)0x0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
  pPVar1 = this->d;
  local_38.first = size;
LAB_004ed5e4:
  local_38.second = p_Var5;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&pPVar1->payouts,&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
  return p_Var5;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }

        if (bs < it_min->first)
        {
            it_min = it;
        }
        if (bs > it_max->first)
        {
            it_max = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        // All chunks in pool are not chosen. Then try to drop some outdated
        // chunks and return them to OS.
        if (it_max->first < size)
        {
            // Current query is asking for a chunk larger than any cached chunks.
            // Then remove the smallest one.
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            // Current query is asking for a chunk smaller than any cached chunks.
            // Then remove the largest one.
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}